

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O1

void __thiscall
testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
          (HasNewFatalFailureHelper *this)

{
  (this->super_TestPartResultReporterInterface)._vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__HasNewFatalFailureHelper_002036e0;
  this->has_new_fatal_failure_ = false;
  UnitTest::GetInstance();
  this->original_reporter_ =
       ((UnitTest::GetInstance::instance.impl_)->per_thread_test_part_result_reporter_).value_;
  UnitTest::GetInstance();
  ((UnitTest::GetInstance::instance.impl_)->per_thread_test_part_result_reporter_).value_ =
       &this->super_TestPartResultReporterInterface;
  return;
}

Assistant:

HasNewFatalFailureHelper::HasNewFatalFailureHelper()
    : has_new_fatal_failure_(false),
      original_reporter_(GetUnitTestImpl()->
                         GetTestPartResultReporterForCurrentThread()) {
  GetUnitTestImpl()->SetTestPartResultReporterForCurrentThread(this);
}